

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O1

char * coda_identifier_from_name(char *name,hashtable *hash_data)

{
  ushort **ppuVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  char *__s;
  
  pcVar8 = "unnamed";
  __s = pcVar8;
  if ((name != (char *)0x0) && (cVar5 = *name, cVar5 != '\0')) {
    ppuVar1 = __ctype_b_loc();
    do {
      __s = name;
      if ((*(byte *)((long)*ppuVar1 + (long)cVar5 * 2 + 1) & 4) != 0) break;
      cVar5 = name[1];
      name = name + 1;
      __s = pcVar8;
    } while (cVar5 != '\0');
  }
  sVar2 = strlen(__s);
  lVar7 = sVar2 << 0x20;
  pcVar8 = (char *)malloc(lVar7 + 0x500000000 >> 0x20);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)0x0;
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                   lVar7 + 0x400000000 >> 0x20,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                   ,0xac);
  }
  else {
    *pcVar8 = *__s;
    if (1 < (int)(uint)sVar2) {
      ppuVar1 = __ctype_b_loc();
      uVar4 = 1;
      do {
        cVar5 = '_';
        if (((*ppuVar1)[__s[uVar4]] & 8) != 0) {
          cVar5 = __s[uVar4];
        }
        pcVar8[uVar4] = cVar5;
        uVar4 = uVar4 + 1;
      } while (((uint)sVar2 & 0x7fffffff) != uVar4);
    }
    pcVar8[lVar7 >> 0x20] = '\0';
    if ((hash_data != (hashtable *)0x0) &&
       (lVar3 = coda_hashtable_get_index_from_name(hash_data,pcVar8), -1 < lVar3)) {
      uVar6 = 1;
      do {
        if (uVar6 == 1000) {
          __assert_fail("counter < 1000",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                        ,0xcb,"char *coda_identifier_from_name(const char *, hashtable *)");
        }
        sprintf(pcVar8 + (lVar7 >> 0x20),"_%d",(ulong)uVar6);
        lVar3 = coda_hashtable_get_index_from_name(hash_data,pcVar8);
        uVar6 = uVar6 + 1;
      } while (-1 < lVar3);
    }
  }
  return pcVar8;
}

Assistant:

char *coda_identifier_from_name(const char *name, hashtable *hash_data)
{
    const int postfix_length = 4;
    char *identifier;
    int length;
    int i;

    if (name == NULL)
    {
        name = "unnamed";
    }
    else
    {
        /* strip leading non-alpha characters */
        while (*name != '\0' && !isalpha(*name))
        {
            name++;
        }
        if (*name == '\0')
        {
            name = "unnamed";
        }
    }

    length = (int)strlen(name);
    /* allow some space for _### postfixes */
    identifier = malloc(length + postfix_length + 1);
    if (identifier == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)(length + postfix_length), __FILE__, __LINE__);
        return NULL;
    }

    /* create identifier */

    /* first character is guaranteed to be an alpha character because of our previous test */
    identifier[0] = name[0];
    /* replace non-alphanumeric characters by a '_' */
    for (i = 1; i < length; i++)
    {
        if (isalnum(name[i]))
        {
            identifier[i] = name[i];
        }
        else
        {
            identifier[i] = '_';
        }
    }
    identifier[length] = '\0';

    /* check for double occurrences */
    if (hash_data != NULL)
    {
        int counter;

        counter = 0;
        while (hashtable_get_index_from_name(hash_data, identifier) >= 0)
        {
            counter++;
            assert(counter < 1000);
            sprintf(&identifier[length], "_%d", counter);
        }
    }

    return identifier;
}